

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void on_recv_data(connection *conn)

{
  size_t *psVar1;
  mg_connection *ri;
  uint *puVar2;
  byte bVar3;
  ns_connection *pnVar4;
  mg_handler_t p_Var5;
  byte *pbVar6;
  ns_connection *pnVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  __int32_t **pp_Var15;
  byte *pbVar16;
  long lVar17;
  connection *conn_1;
  byte bVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  uchar c;
  char b64_sha [40];
  char sha [20];
  unsigned_short n;
  uchar local_2d9;
  uchar local_2d8 [48];
  byte abStack_2a8 [32];
  SHA1_CTX local_288;
  uchar local_228 [504];
  
  pnVar4 = conn->ns_conn;
  if (conn->endpoint_type == EP_PROXY) {
    if ((conn->endpoint).nc == (ns_connection *)0x0) {
      return;
    }
    ns_forward(pnVar4,(conn->endpoint).nc);
    return;
  }
  try_parse(conn);
  if ((conn->request_len < 0) ||
     ((((conn->request_len != 0 && (pcVar12 = (conn->mg_conn).uri, *pcVar12 != '/')) &&
       (iVar8 = strcmp(pcVar12,"*"), iVar8 != 0)) &&
      ((iVar8 = mg_strncasecmp(pcVar12,"http",4), iVar8 != 0 &&
       (iVar8 = __isoc99_sscanf(pcVar12,"%*[^ :]:%hu",local_228), iVar8 < 1)))))) {
    iVar8 = 400;
  }
  else {
    iVar8 = conn->request_len;
    if ((iVar8 == 0) && (0x4000 < (pnVar4->recv_iobuf).len)) {
      iVar8 = 0x19d;
    }
    else {
      if (iVar8 < 1) goto LAB_0010b3d2;
      pcVar12 = (conn->mg_conn).http_version;
      iVar11 = strcmp(pcVar12,"1.0");
      if ((iVar11 == 0) || (iVar11 = strcmp(pcVar12,"1.1"), iVar11 == 0)) {
        if ((0 < iVar8) && (conn->endpoint_type == EP_NONE)) {
          ri = &conn->mg_conn;
          pcVar12 = mg_get_header(ri,"Sec-WebSocket-Version");
          pcVar13 = mg_get_header(ri,"Sec-WebSocket-Key");
          if (pcVar13 != (char *)0x0 && pcVar12 != (char *)0x0) {
            (conn->mg_conn).is_websocket = 1;
            if (((conn->server == (mg_server *)0x0) ||
                (p_Var5 = conn->server->event_handler, p_Var5 == (mg_handler_t)0x0)) ||
               (iVar8 = (*p_Var5)(ri,MG_WS_HANDSHAKE), iVar8 == 0)) {
              bVar18 = 0;
              mg_snprintf((char *)local_228,500,"%s%s",pcVar13,
                          "258EAFA5-E914-47DA-95CA-C5AB0DC85B11");
              local_288.state[0] = 0x67452301;
              local_288.state[1] = 0xefcdab89;
              local_288.state[2] = 0x98badcfe;
              local_288.state[3] = 0x10325476;
              local_288.state[4] = 0xc3d2e1f0;
              local_288.count[0] = 0;
              local_288._24_8_ = (ulong)(uint)local_288.buffer._0_4_ << 0x20;
              sVar14 = strlen((char *)local_228);
              SHA1Update(&local_288,local_228,(uint32_t)sVar14);
              uVar20 = 0;
              do {
                local_2d8[uVar20] = (uchar)(local_288.count[uVar20 < 4] >> (~bVar18 & 0x18));
                uVar20 = uVar20 + 1;
                bVar18 = bVar18 + 8;
              } while (uVar20 != 8);
              local_2d9 = 0x80;
              SHA1Update(&local_288,&local_2d9,1);
              if ((local_288.count[0] & 0x1f8) != 0x1c0) {
                do {
                  local_2d9 = '\0';
                  SHA1Update(&local_288,&local_2d9,1);
                } while ((local_288.count[0] & 0x1f8) != 0x1c0);
              }
              SHA1Update(&local_288,local_2d8,8);
              bVar18 = 0;
              lVar17 = 0;
              do {
                abStack_2a8[lVar17] =
                     (byte)(*(uint *)((long)local_288.state + (ulong)((uint)lVar17 & 0xfffffffc)) >>
                           (~bVar18 & 0x18));
                lVar17 = lVar17 + 1;
                bVar18 = bVar18 + 8;
              } while (lVar17 != 0x14);
              local_288.buffer[0x34] = '\0';
              local_288.buffer[0x35] = '\0';
              local_288.buffer[0x36] = '\0';
              local_288.buffer[0x37] = '\0';
              local_288.buffer[0x38] = '\0';
              local_288.buffer[0x39] = '\0';
              local_288.buffer[0x3a] = '\0';
              local_288.buffer[0x3b] = '\0';
              local_288.buffer[0x3c] = '\0';
              local_288.buffer[0x3d] = '\0';
              local_288.buffer[0x3e] = '\0';
              local_288.buffer[0x3f] = '\0';
              local_288.buffer[0x24] = '\0';
              local_288.buffer[0x25] = '\0';
              local_288.buffer[0x26] = '\0';
              local_288.buffer[0x27] = '\0';
              local_288.buffer[0x28] = '\0';
              local_288.buffer[0x29] = '\0';
              local_288.buffer[0x2a] = '\0';
              local_288.buffer[0x2b] = '\0';
              local_288.buffer[0x2c] = '\0';
              local_288.buffer[0x2d] = '\0';
              local_288.buffer[0x2e] = '\0';
              local_288.buffer[0x2f] = '\0';
              local_288.buffer[0x30] = '\0';
              local_288.buffer[0x31] = '\0';
              local_288.buffer[0x32] = '\0';
              local_288.buffer[0x33] = '\0';
              local_288.buffer[0x14] = '\0';
              local_288.buffer[0x15] = '\0';
              local_288.buffer[0x16] = '\0';
              local_288.buffer[0x17] = '\0';
              local_288.buffer[0x18] = '\0';
              local_288.buffer[0x19] = '\0';
              local_288.buffer[0x1a] = '\0';
              local_288.buffer[0x1b] = '\0';
              local_288.buffer[0x1c] = '\0';
              local_288.buffer[0x1d] = '\0';
              local_288.buffer[0x1e] = '\0';
              local_288.buffer[0x1f] = '\0';
              local_288.buffer[0x20] = '\0';
              local_288.buffer[0x21] = '\0';
              local_288.buffer[0x22] = '\0';
              local_288.buffer[0x23] = '\0';
              local_288.buffer[4] = '\0';
              local_288.buffer[5] = '\0';
              local_288.buffer[6] = '\0';
              local_288.buffer[7] = '\0';
              local_288.buffer[8] = '\0';
              local_288.buffer[9] = '\0';
              local_288.buffer[10] = '\0';
              local_288.buffer[0xb] = '\0';
              local_288.buffer[0xc] = '\0';
              local_288.buffer[0xd] = '\0';
              local_288.buffer[0xe] = '\0';
              local_288.buffer[0xf] = '\0';
              local_288.buffer[0x10] = '\0';
              local_288.buffer[0x11] = '\0';
              local_288.buffer[0x12] = '\0';
              local_288.buffer[0x13] = '\0';
              local_288.state[4] = 0;
              local_288.count[0] = 0;
              local_288.count[1] = 0;
              local_288.buffer[0] = '\0';
              local_288.buffer[1] = '\0';
              local_288.buffer[2] = '\0';
              local_288.buffer[3] = '\0';
              local_288.state[0] = 0;
              local_288.state[1] = 0;
              local_288.state[2] = 0;
              local_288.state[3] = 0;
              uVar9 = 0;
              uVar20 = 0;
              do {
                uVar10 = 0;
                if (uVar20 < 0x12) {
                  uVar10 = (uint)abStack_2a8[uVar20 + 2];
                }
                bVar18 = abStack_2a8[uVar20];
                bVar3 = abStack_2a8[uVar20 + 1];
                lVar17 = (long)(int)uVar9;
                local_2d8[lVar17] =
                     "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar18 >> 2]
                ;
                local_2d8[lVar17 + 1] =
                     "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                     [(uint)(bVar3 >> 4) | (bVar18 & 3) << 4];
                local_2d8[lVar17 + 2] =
                     "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                     [(uVar10 >> 6) + (bVar3 & 0xf) * 4];
                uVar22 = lVar17 + 3;
                if (uVar20 < 0x12) {
                  local_2d8[lVar17 + 3] =
                       "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                       [uVar10 & 0x3f];
                  uVar22 = (ulong)(uVar9 + 4);
                }
                uVar9 = (uint)uVar22;
                bVar23 = uVar20 < 0x11;
                uVar20 = uVar20 + 3;
              } while (bVar23);
              if ((uVar22 & 3) != 0) {
                memset(local_2d8 + (int)uVar9,0x3d,(ulong)(4 - (uVar9 & 3)));
                uVar9 = uVar9 - (uVar9 | 0xfffffffc);
              }
              local_2d8[(int)uVar9] = '\0';
              mg_snprintf((char *)local_228,500,"%s%s%s",
                          "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
                          ,local_2d8,"\r\n\r\n");
              sVar14 = strlen((char *)local_228);
              ns_out(conn->ns_conn,local_228,(long)(int)sVar14);
            }
            if ((conn->server != (mg_server *)0x0) &&
               (p_Var5 = conn->server->event_handler, p_Var5 != (mg_handler_t)0x0)) {
              (*p_Var5)(ri,MG_WS_CONNECT);
            }
          }
          pcVar12 = mg_get_header(ri,"Expect");
          if (pcVar12 != (char *)0x0) {
            pp_Var15 = __ctype_tolower_loc();
            lVar17 = 0;
            do {
              iVar8 = (*pp_Var15)[(byte)pcVar12[lVar17]];
              iVar11 = (*pp_Var15)[(byte)"100-continue"[lVar17]];
              if (pcVar12[lVar17] == 0) break;
              lVar17 = lVar17 + 1;
            } while (iVar8 == iVar11);
            if (iVar8 == iVar11) {
              ns_out(conn->ns_conn,"HTTP/1.1 100 Continue\r\n\r\n",0x19);
            }
          }
          open_local_endpoint(conn,0);
        }
        goto LAB_0010b3d2;
      }
      iVar8 = 0x1f9;
    }
  }
  send_http_error(conn,iVar8,(char *)0x0);
LAB_0010b3d2:
  if ((conn->endpoint_type == EP_CGI) && ((conn->endpoint).nc != (ns_connection *)0x0)) {
    ns_forward(conn->ns_conn,(conn->endpoint).nc);
  }
  if (conn->endpoint_type == EP_USER) {
    (conn->mg_conn).content = (pnVar4->recv_iobuf).buf;
    (conn->mg_conn).content_len = (pnVar4->recv_iobuf).len;
    uVar9 = 0;
    if (((conn != (connection *)0x0) && (conn->server != (mg_server *)0x0)) &&
       (p_Var5 = conn->server->event_handler, p_Var5 != (mg_handler_t)0x0)) {
      uVar9 = (*p_Var5)(&conn->mg_conn,MG_RECV);
    }
    if ((int)uVar9 < 0) {
      puVar2 = &conn->ns_conn->flags;
      *puVar2 = *puVar2 | 1;
    }
    else if (((uVar9 != 0) && (uVar20 = (ulong)uVar9, uVar20 <= (pnVar4->recv_iobuf).len)) &&
            (uVar22 = (pnVar4->recv_iobuf).len, uVar20 <= uVar22)) {
      pcVar12 = (pnVar4->recv_iobuf).buf;
      memmove(pcVar12,pcVar12 + uVar20,uVar22 - uVar20);
      psVar1 = &(pnVar4->recv_iobuf).len;
      *psVar1 = *psVar1 - uVar20;
    }
    if ((conn->mg_conn).is_websocket == 0) {
      if ((long)conn->request_len + conn->cl <= conn->num_bytes_recv) {
        (conn->mg_conn).content = (conn->ns_conn->recv_iobuf).buf;
        iVar8 = 0;
        if ((conn->server != (mg_server *)0x0) &&
           (p_Var5 = conn->server->event_handler, p_Var5 != (mg_handler_t)0x0)) {
          iVar8 = (*p_Var5)(&conn->mg_conn,MG_REQUEST);
        }
        if (iVar8 == 0) {
          open_local_endpoint(conn,1);
        }
        else if (iVar8 == 1) {
          if ((conn->ns_conn->flags & 0x100000) != 0) {
            ns_out(conn->ns_conn,"0\r\n\r\n",5);
          }
          close_local_endpoint(conn);
        }
      }
    }
    else {
      do {
        pbVar6 = (byte *)(conn->ns_conn->recv_iobuf).buf;
        iVar8 = (int)(conn->ns_conn->recv_iobuf).len;
        uVar10 = 0;
        uVar9 = 0;
        uVar19 = 0;
        if (1 < iVar8) {
          uVar19 = pbVar6[1] & 0x7f;
          uVar10 = pbVar6[1] >> 5 & 4;
          if (iVar8 < (int)uVar10 || 0x7d < (byte)uVar19) {
            if (((byte)uVar19 == 0x7e) && (uVar9 = uVar10 + 4, (int)uVar9 <= iVar8)) {
              uVar19 = (uint)(ushort)(*(ushort *)(pbVar6 + 2) << 8 | *(ushort *)(pbVar6 + 2) >> 8);
            }
            else {
              uVar9 = uVar10 | 10;
              if (iVar8 < (int)uVar9) {
                uVar9 = 0;
                uVar19 = 0;
              }
              else {
                uVar19 = *(uint *)(pbVar6 + 6);
                uVar19 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                         uVar19 << 0x18;
              }
            }
          }
          else {
            uVar9 = uVar10 | 2;
          }
        }
        uVar21 = uVar19 + uVar9;
        bVar23 = SCARRY4(uVar19,uVar9) != (int)uVar21 < 0;
        if (iVar8 < (int)uVar21 || (uVar21 == 0 || bVar23)) break;
        (conn->mg_conn).content_len = (long)(int)uVar19;
        pbVar16 = pbVar6 + uVar9;
        (conn->mg_conn).content = (char *)pbVar16;
        (conn->mg_conn).wsbits = (uint)*pbVar6;
        if ((uVar10 != 0) && (0 < (int)uVar19)) {
          uVar20 = 0;
          do {
            pbVar16[uVar20] = pbVar16[uVar20] ^ pbVar16[(ulong)((uint)uVar20 & 3) - (ulong)uVar10];
            uVar20 = uVar20 + 1;
          } while (uVar19 != uVar20);
        }
        if (((conn->server == (mg_server *)0x0) ||
            (p_Var5 = conn->server->event_handler, p_Var5 == (mg_handler_t)0x0)) ||
           (iVar11 = (*p_Var5)(&conn->mg_conn,MG_REQUEST), iVar11 == 0)) {
          puVar2 = &conn->ns_conn->flags;
          *puVar2 = *puVar2 | 1;
        }
        pnVar7 = conn->ns_conn;
        uVar22 = (ulong)uVar21;
        uVar20 = (pnVar7->recv_iobuf).len;
        if (uVar22 <= uVar20) {
          pcVar12 = (pnVar7->recv_iobuf).buf;
          memmove(pcVar12,pcVar12 + uVar22,uVar20 - uVar22);
          psVar1 = &(pnVar7->recv_iobuf).len;
          *psVar1 = *psVar1 - uVar22;
        }
      } while (iVar8 >= (int)uVar21 && (uVar21 != 0 && !bVar23));
    }
  }
  if ((conn->endpoint_type == EP_PUT) && ((pnVar4->recv_iobuf).len != 0)) {
    pnVar4 = conn->ns_conn;
    sVar14 = (pnVar4->recv_iobuf).len;
    if (conn->cl < (long)sVar14) {
      sVar14 = conn->cl;
    }
    uVar20 = write((conn->endpoint).fd,(pnVar4->recv_iobuf).buf,sVar14);
    if (0 < (int)uVar20) {
      uVar20 = uVar20 & 0x7fffffff;
      if ((uVar20 != 0) && (uVar22 = (pnVar4->recv_iobuf).len, uVar20 <= uVar22)) {
        pcVar12 = (pnVar4->recv_iobuf).buf;
        memmove(pcVar12,pcVar12 + uVar20,uVar22 - uVar20);
        psVar1 = &(pnVar4->recv_iobuf).len;
        *psVar1 = *psVar1 - uVar20;
      }
      conn->cl = conn->cl - uVar20;
    }
    if (conn->cl < 1) {
      close_local_endpoint(conn);
    }
  }
  return;
}

Assistant:

static void on_recv_data(struct connection *conn) {
  struct iobuf *io = &conn->ns_conn->recv_iobuf;
  int n;

  if (conn->endpoint_type == EP_PROXY) {
    if (conn->endpoint.nc != NULL) do_proxy(conn);
    return;
  }

  try_parse(conn);
  DBG(("%p %d %lu %d", conn, conn->request_len, (unsigned long)io->len,
       conn->ns_conn->flags));
  if (conn->request_len < 0 ||
      (conn->request_len > 0 && !is_valid_uri(conn->mg_conn.uri))) {
    send_http_error(conn, 400, NULL);
  } else if (conn->request_len == 0 && io->len > MAX_REQUEST_SIZE) {
    send_http_error(conn, 413, NULL);
  } else if (conn->request_len > 0 &&
             strcmp(conn->mg_conn.http_version, "1.0") != 0 &&
             strcmp(conn->mg_conn.http_version, "1.1") != 0) {
    send_http_error(conn, 505, NULL);
  } else if (conn->request_len > 0 && conn->endpoint_type == EP_NONE) {
#ifndef MONGOOSE_NO_WEBSOCKET
    send_websocket_handshake_if_requested(&conn->mg_conn);
#endif
    send_continue_if_expected(conn);
    open_local_endpoint(conn, 0);
  }

#ifndef MONGOOSE_NO_CGI
  if (conn->endpoint_type == EP_CGI && conn->endpoint.nc != NULL) {
    ns_forward(conn->ns_conn, conn->endpoint.nc);
  }
#endif
  if (conn->endpoint_type == EP_USER) {
    conn->mg_conn.content = io->buf;
    conn->mg_conn.content_len = io->len;
    n = call_user(conn, MG_RECV);
    if (n < 0) {
      conn->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    } else if ((size_t) n <= io->len) {
      iobuf_remove(io, n);
    }
    call_request_handler_if_data_is_buffered(conn);
  }
#ifndef MONGOOSE_NO_DAV
  if (conn->endpoint_type == EP_PUT && io->len > 0) {
    forward_put_data(conn);
  }
#endif
}